

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SpecType ty)

{
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  int local_14;
  string *psStack_10;
  SpecType ty_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeAttribute",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeConnection",&local_16);
    std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else if (local_14 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeExpression",&local_17);
    std::allocator<char>::~allocator((allocator<char> *)&local_17);
  }
  else if (local_14 == 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeMapper",&local_18);
    std::allocator<char>::~allocator((allocator<char> *)&local_18);
  }
  else if (local_14 == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeMapperArg",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (local_14 == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypePrim",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else if (local_14 == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypePseudoRoot",&local_1b);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  }
  else if (local_14 == 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeRelationship",&local_1c);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c);
  }
  else if (local_14 == 9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"SpecTypeRelationshipTarget",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else if (local_14 == 10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeVariant",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (local_14 == 0xb) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeVariantSet",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SpecTypeInvalid",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::SpecType ty) {
  if (SpecType::Attribute == ty) {
    return "SpecTypeAttribute";
  } else if (SpecType::Connection == ty) {
    return "SpecTypeConnection";
  } else if (SpecType::Expression == ty) {
    return "SpecTypeExpression";
  } else if (SpecType::Mapper == ty) {
    return "SpecTypeMapper";
  } else if (SpecType::MapperArg == ty) {
    return "SpecTypeMapperArg";
  } else if (SpecType::Prim == ty) {
    return "SpecTypePrim";
  } else if (SpecType::PseudoRoot == ty) {
    return "SpecTypePseudoRoot";
  } else if (SpecType::Relationship == ty) {
    return "SpecTypeRelationship";
  } else if (SpecType::RelationshipTarget == ty) {
    return "SpecTypeRelationshipTarget";
  } else if (SpecType::Variant == ty) {
    return "SpecTypeVariant";
  } else if (SpecType::VariantSet == ty) {
    return "SpecTypeVariantSet";
  }
  return "SpecTypeInvalid";
}